

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O2

Enum * __thiscall cppgenerate::Enum::setName(Enum *this,string *name)

{
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  sanitizeString(&local_30,&local_50);
  std::__cxx11::string::operator=((string *)this,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return this;
}

Assistant:

Enum& Enum::setName( std::string name ){
    m_name = cppgenerate::sanitizeString( name );
    return *this;
}